

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
          (PromiseDisposer *this,OwnPromiseNode *next,SourceLocation *params)

{
  PromiseArenaMember *pPVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode node;
  OwnPromiseNode local_28;
  
  pPVar1 = &next->ptr->super_PromiseArenaMember;
  pPVar2 = pPVar1->arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x70) {
    alloc<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              (this,next,params);
  }
  else {
    pPVar1->arena = (PromiseArena *)0x0;
    next->ptr = (PromiseNode *)0x0;
    local_28.ptr = (PromiseNode *)pPVar1;
    ChainPromiseNode::ChainPromiseNode((ChainPromiseNode *)(pPVar1 + -7),&local_28,*params);
    node.ptr = local_28.ptr;
    if (&(local_28.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_28.ptr = (PromiseNode *)0x0;
      dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    pPVar1[-7].arena = pPVar2;
    *(ChainPromiseNode **)this = (ChainPromiseNode *)(pPVar1 + -7);
  }
  return (Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>)(ChainPromiseNode *)this;
}

Assistant:

static kj::Own<T, D> appendPromise(
      OwnPromiseNode&& next, Params&&... params) noexcept {
    // Append a promise to the arena that currently ends with `next`. `next` is also still passed as
    // the first parameter to the new object's constructor.
    //
    // This is semantically the same as `allocPromise()` except that it may avoid the underlying
    // memory allocation. `next` must end up being destroyed before the new object (i.e. the new
    // object must never transfer away ownership of `next`).


    PromiseArena* arena = next->arena;

    if (!canArenaAllocate<T>() || arena == nullptr ||
        reinterpret_cast<byte*>(next.get()) - reinterpret_cast<byte*>(arena) < sizeof(T)) {
      // No arena available, or not enough space, or weird alignment needed. Start new arena.
      return alloc<T, D>(kj::mv(next), kj::fwd<Params>(params)...);
    } else {
      // Append to arena.
      //
      // NOTE: When we call ctor(), it takes ownership of `next`, so we shouldn't assume `next`
      //   still exists after it returns. So we have to remove ownership of the arena before that.
      //   In theory if we wanted this to be exception-safe, we'd also have to arrange to delete
      //   the arena if the constructor throws. However, in practice none of the PromiseNode
      //   constructors throw, so we just mark the whole method noexcept in order to avoid the
      //   code bloat to handle this case.
      next->arena = nullptr;
      T* ptr = reinterpret_cast<T*>(next.get()) - 1;
      ctor(*ptr, kj::mv(next), kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
      return kj::Own<T, D>(ptr);
    }
  }